

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O3

MMAL_COMPONENT_T * __thiscall
raspicam::_private::Private_Impl::create_camera_component(Private_Impl *this,RASPIVID_STATE *state)

{
  MMAL_PORT_T *port;
  MMAL_ES_FORMAT_T *pMVar1;
  MMAL_STATUS_T MVar2;
  MMAL_POOL_T *pMVar3;
  ulong uVar4;
  MMAL_FOURCC_T MVar5;
  long lVar6;
  char *pcVar7;
  MMAL_COMPONENT_T *camera;
  MMAL_COMPONENT_T *local_50;
  MMAL_PARAMETER_HEADER_T local_48;
  int local_40;
  int local_3c;
  undefined8 local_38;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_50 = (MMAL_COMPONENT_T *)0x0;
  MVar2 = mmal_component_create("vc.ril.camera",&local_50);
  if (MVar2 == MMAL_SUCCESS) {
    if (local_50->output_num == 0) {
      pcVar7 = "Camera doesn\'t have output ports";
      lVar6 = 0x20;
    }
    else {
      port = local_50->output[1];
      local_48.id = 0x10015;
      local_48.size = 0x30;
      local_40 = state->width;
      local_3c = state->height;
      local_38 = 0;
      local_28 = 3;
      uStack_20 = 0x200000000;
      local_30 = local_40;
      local_2c = local_3c;
      mmal_port_parameter_set(local_50->control,&local_48);
      pMVar1 = port->format;
      this->format = pMVar1;
      uVar4 = (ulong)(this->State).captureFtm;
      MVar5 = 0x30323449;
      if (uVar4 < 4) {
        MVar5 = *(MMAL_FOURCC_T *)(&DAT_0010d050 + uVar4 * 4);
      }
      pMVar1->encoding_variant = MVar5;
      pMVar1->encoding = MVar5;
      (pMVar1->es->audio).channels = state->width + 0x1fU & 0xffffffe0;
      (this->format->es->audio).sample_rate = state->height + 0xfU & 0xfffffff0;
      (this->format->es->audio).bits_per_sample = 0;
      (this->format->es->audio).block_align = 0;
      (this->format->es->video).crop.width = state->width;
      (this->format->es->video).crop.height = state->height;
      (this->format->es->video).frame_rate.num = state->framerate;
      (this->format->es->video).frame_rate.den = 1;
      MVar2 = mmal_port_format_commit(port);
      if (MVar2 == MMAL_SUCCESS) {
        MVar2 = mmal_port_enable(port,video_buffer_callback);
        if (MVar2 == MMAL_SUCCESS) {
          port->buffer_size = port->buffer_size_recommended;
          port->buffer_num = port->buffer_num_recommended;
          pMVar3 = mmal_port_pool_create
                             (port,port->buffer_num_recommended,port->buffer_size_recommended);
          if (pMVar3 == (MMAL_POOL_T *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Failed to create buffer header pool for video output port",0x39);
          }
          state->video_pool = pMVar3;
          MVar2 = mmal_component_enable(local_50);
          if (MVar2 == MMAL_SUCCESS) {
            state->camera_component = local_50;
            return local_50;
          }
          pcVar7 = "camera component couldn\'t be enabled";
          lVar6 = 0x24;
        }
        else {
          pcVar7 = "camera video callback2 error";
          lVar6 = 0x1c;
        }
      }
      else {
        pcVar7 = "camera video format couldn\'t be set";
        lVar6 = 0x23;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar6);
    mmal_component_destroy(local_50);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to create camera component",0x21);
  }
  return (MMAL_COMPONENT_T *)0x0;
}

Assistant:

MMAL_COMPONENT_T *Private_Impl::create_camera_component ( RASPIVID_STATE *state ) {
            MMAL_COMPONENT_T *camera = 0;
            MMAL_PORT_T  *video_port = NULL;

            MMAL_STATUS_T status;
            /* Create the component */
            status = mmal_component_create ( MMAL_COMPONENT_DEFAULT_CAMERA, &camera );

            if ( status != MMAL_SUCCESS ) {
                cerr<< ( "Failed to create camera component" );
                return 0;
            }

            if ( !camera->output_num ) {
                cerr<< ( "Camera doesn't have output ports" );
                mmal_component_destroy ( camera );
                return 0;
            }

            video_port = camera->output[MMAL_CAMERA_VIDEO_PORT];

            //  set up the camera configuration

            MMAL_PARAMETER_CAMERA_CONFIG_T cam_config;
            cam_config.hdr.id=MMAL_PARAMETER_CAMERA_CONFIG;
            cam_config.hdr.size=sizeof ( cam_config );
            cam_config.max_stills_w = state->width;
            cam_config.max_stills_h = state->height;
            cam_config.stills_yuv422 = 0;
            cam_config.one_shot_stills = 0;
            cam_config.max_preview_video_w = state->width;
            cam_config.max_preview_video_h = state->height;
            cam_config.num_preview_video_frames = 3;
            cam_config.stills_capture_circular_buffer_height = 0;
            cam_config.fast_preview_resume = 0;
            cam_config.use_stc_timestamp = MMAL_PARAM_TIMESTAMP_MODE_RESET_STC;
            mmal_port_parameter_set ( camera->control, &cam_config.hdr );

            // Set the encode format on the video  port

            format = video_port->format;
            format->encoding_variant =   convertFormat ( State.captureFtm );
            format->encoding = convertFormat ( State.captureFtm );
            format->es->video.width = VCOS_ALIGN_UP(state->width, 32);
            format->es->video.height = VCOS_ALIGN_UP(state->height, 16);
            format->es->video.crop.x = 0;
            format->es->video.crop.y = 0;
            format->es->video.crop.width = state->width;
            format->es->video.crop.height = state->height;
            format->es->video.frame_rate.num =  state->framerate;
            format->es->video.frame_rate.den = VIDEO_FRAME_RATE_DEN;

            status = mmal_port_format_commit ( video_port );
            if ( status ) {
                cerr<< ( "camera video format couldn't be set" );
                mmal_component_destroy ( camera );
                return 0;
            }

            // PR : plug the callback to the video port
            status = mmal_port_enable ( video_port,video_buffer_callback );
            if ( status ) {
                cerr<< ( "camera video callback2 error" );
                mmal_component_destroy ( camera );
                return 0;
            }

            // Ensure there are enough buffers to avoid dropping frames
            if ( video_port->buffer_num < VIDEO_OUTPUT_BUFFERS_NUM )
                video_port->buffer_num = VIDEO_OUTPUT_BUFFERS_NUM;



            //PR : create pool of message on video port
            MMAL_POOL_T *pool;
            video_port->buffer_size = video_port->buffer_size_recommended;
            video_port->buffer_num = video_port->buffer_num_recommended;
            pool = mmal_port_pool_create ( video_port, video_port->buffer_num, video_port->buffer_size );
            if ( !pool ) {
                cerr<< ( "Failed to create buffer header pool for video output port" );
            }
            state->video_pool = pool;


            /* Enable component */
            status = mmal_component_enable ( camera );

            if ( status ) {
                cerr<< ( "camera component couldn't be enabled" );
                mmal_component_destroy ( camera );
                return 0;
            }

            state->camera_component = camera;//this needs to be before set_all_parameters

            return camera;
        }